

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CsvHelper.cpp
# Opt level: O1

int CsvHelper::read_string(char *text,int text_max,size_t start,char *buffer,size_t buffer_max)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  
  sVar1 = start;
  if (start < buffer_max) {
    do {
      start = sVar1;
      cVar6 = buffer[start];
      if ((cVar6 != '\t') && (cVar6 != ' ')) {
        if (cVar6 == '\"') {
          start = start + 1;
          if (buffer_max <= start) goto LAB_0016d533;
          iVar4 = 0;
          goto LAB_0016d4b0;
        }
        break;
      }
      sVar1 = start + 1;
      start = buffer_max;
    } while (buffer_max != sVar1);
  }
  if (start < buffer_max) {
    iVar4 = 0;
    do {
      cVar6 = buffer[start];
      uVar2 = start;
      if ((cVar6 == '\0') || (cVar6 == ',')) break;
      if (iVar4 < text_max + -1) {
        text[iVar4] = cVar6;
        iVar4 = iVar4 + 1;
      }
      start = start + 1;
      uVar2 = buffer_max;
    } while (buffer_max != start);
  }
  else {
LAB_0016d533:
    iVar4 = 0;
    uVar2 = start;
  }
LAB_0016d535:
  text[iVar4] = '\0';
  uVar3 = uVar2;
  if (uVar2 < buffer_max) {
    do {
      cVar6 = buffer[uVar2];
      if ((cVar6 != '\t') && (cVar6 != ' ')) {
        uVar3 = uVar2;
        if (cVar6 == ',') {
          return (int)uVar2 + 1;
        }
        break;
      }
      uVar2 = uVar2 + 1;
      uVar3 = buffer_max;
    } while (buffer_max != uVar2);
  }
  return (int)uVar3;
  while( true ) {
    if (iVar4 < text_max + -1) {
      text[iVar4] = cVar6;
      iVar4 = iVar4 + 1;
    }
    start = start + lVar5;
    uVar2 = start;
    if (buffer_max <= start) break;
LAB_0016d4b0:
    cVar6 = buffer[start];
    if (cVar6 == '\"') {
      uVar2 = start + 1;
      if ((buffer_max <= uVar2) || (buffer[uVar2] != '\"')) break;
      lVar5 = 2;
      cVar6 = '\"';
    }
    else {
      uVar2 = start;
      if (cVar6 == '\0') break;
      lVar5 = 1;
    }
  }
  goto LAB_0016d535;
}

Assistant:

int CsvHelper::read_string(char* text, int text_max, size_t start, char const * buffer, size_t buffer_max)
{
    int x = 0;

    /* Skip blanks */
    while (start < buffer_max && (buffer[start] == ' ' || buffer[start] == '\t'))
    {
        start++;
    }

    /* If quoted, copy quoted, else copy */
    if (start < buffer_max && buffer[start] == '"')
    {
#if 0
        if (x < (text_max - 1))
        {
            text[x] = buffer[start];
            x++;
        }
#endif
        start++;
        while (start < buffer_max && buffer[start] != 0)
        {
            if (buffer[start] == '"')
            {
#if 0
                /* Copy the quote and skip it. */
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
#endif
                start++;
                /* Test whether there is a double quote */
                if (start < buffer_max && buffer[start] == '"')
                {
                    /* copy the double quote and continue */
                    if (x < (text_max - 1))
                    {
                        text[x] = buffer[start];
                        x++;
                    }
                    start++;
                }
                else
                {
                    /* This was the final quote */
                    break;
                }
            }
            else
            {
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
                start++;
            }
        }
    }
    else
    {
        while (start < buffer_max && buffer[start] != 0 && buffer[start] != ',')
        {
            if (x < (text_max - 1))
            {
                text[x] = buffer[start];
                x++;
            }
            start++;
        }
    }
    text[x] = 0;

    /* Skip comma */
    while (start < buffer_max)
    {
        if (buffer[start] == ',')
        {
            start++;
            break;
        }
        else if (buffer[start] == ' ' || buffer[start] == '\t')
        {
            start++;
        }
        else
        {
            break;
        }
    }

    return (int)start;
}